

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_archiver.cpp
# Opt level: O2

void __thiscall HuffmanArchiver::unzip(HuffmanArchiver *this,istream *cin,ostream *cout)

{
  char data;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  BitReader in;
  vector<bool,_std::allocator<bool>_> code;
  HuffTree tree;
  _Bvector_base<std::allocator<bool>_> local_a8;
  pair<bool,_char> node;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  HuffTree::HuffTree(&tree);
  code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)0x0;
  BitReader::BitReader(&in,cin);
  iVar1 = BitReader::read_buf(&in,0x40);
  this->num_of_symbols_out = (long)iVar1;
  iVar2 = BitReader::read_buf(&in,0x20);
  iVar3 = BitReader::read_buf(&in,0x10);
  lVar5 = 0;
  iVar1 = 0;
  if (0 < iVar2) {
    iVar1 = iVar2;
  }
  for (; lVar5 != iVar3; lVar5 = lVar5 + 1) {
    code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p =
         code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
         super__Bit_iterator_base._M_p;
    code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    data = BitReader::read_char(&in);
    iVar6 = iVar1;
    while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
      iVar4 = BitReader::read_buf(&in,1);
      std::vector<bool,_std::allocator<bool>_>::push_back(&code,iVar4 != 0);
    }
    std::__reverse<std::_Bit_iterator>
              (code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p,0,
               code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_finish.super__Bit_iterator_base._M_p,
               code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_finish.super__Bit_iterator_base._M_offset);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&local_58,&code);
    decode_full_code((vector<bool,_std::allocator<bool>_> *)&node,
                     (vector<bool,_std::allocator<bool>_> *)&local_58);
    std::vector<bool,_std::allocator<bool>_>::operator=
              (&code,(vector<bool,_std::allocator<bool>_> *)&node);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)&node);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&local_a8,&code);
    HuffTree::add_code(&tree,data,(vector<bool,_std::allocator<bool>_> *)&local_a8);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_a8);
  }
  this->used_additional_bytes = (long)iVar3 * (long)(iVar2 + 8) + 0x70U >> 3;
  node.first = false;
  node.second = '\0';
  HuffTree::back_to_root(&tree);
  uVar7 = 0;
  while (uVar7 < this->num_of_symbols_out) {
    iVar1 = BitReader::read_buf(&in,1);
    node = HuffTree::walk(&tree,iVar1 != 0);
    if (((ushort)node & 1) != 0) {
      std::ostream::write((char *)cout,(long)&node.second);
      HuffTree::back_to_root(&tree);
      uVar7 = uVar7 + 1;
    }
  }
  lVar5 = std::istream::tellg();
  this->num_of_symbols_in = lVar5 - this->used_additional_bytes;
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&code.super__Bvector_base<std::allocator<bool>_>);
  std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
            (&tree.root);
  return;
}

Assistant:

void HuffmanArchiver::unzip(std::istream &cin, std::ostream &cout) {
    HuffTree tree;
    std::vector<bool> code;

    BitReader in(cin);

    num_of_symbols_out = static_cast<std::size_t>(in.read_buf(BITS_IN_SIZE_T));
    int full_code_size = in.read_buf(BITS_IN_INT);
    auto size = static_cast<std::size_t>(in.read_buf(ALPHABET_SIZE));

    char ch;
    for (std::size_t i = 0; i < size; i++) {
        code.clear();
        ch = in.read_char();
        for (int j = 0; j < full_code_size; j++) {
            code.push_back(static_cast<bool>(in.read_buf(1)));
        }
        std::reverse(code.begin(), code.end());
        code = decode_full_code(code);
        tree.add_code(ch, code);
    }

    used_additional_bytes = BITS_IN_SIZE_T + ALPHABET_SIZE + size * (BITS_IN_BYTE + full_code_size)
                            + BITS_IN_INT;
    used_additional_bytes /= BITS_IN_BYTE;

    bool bit;
    std::pair<bool, char> node;
    tree.back_to_root();
    std::size_t i = 0;
    while (i < num_of_symbols_out) {
        bit = (bool) in.read_buf(1);
        node = tree.walk(bit);
        if (node.first) {
            cout.write(reinterpret_cast<const char *>(&node.second), 1);
            tree.back_to_root();
            i++;
        }
    }
    num_of_symbols_in = static_cast<std::size_t >(cin.tellg()) - used_additional_bytes;
}